

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsCreateExternalObjectWithPrototype
          (void *data,JsFinalizeCallback finalizeCallback,JsValueRef prototype,JsValueRef *object)

{
  anon_class_32_4_d20d6fe5 fn;
  JsErrorCode JVar1;
  JsValueRef *local_28;
  JsValueRef *object_local;
  JsValueRef prototype_local;
  JsFinalizeCallback finalizeCallback_local;
  void *data_local;
  
  fn.object = &local_28;
  fn.prototype = &object_local;
  fn.data = &finalizeCallback_local;
  fn.finalizeCallback = (JsFinalizeCallback *)&prototype_local;
  local_28 = object;
  object_local = (JsValueRef *)prototype;
  prototype_local = finalizeCallback;
  finalizeCallback_local = (JsFinalizeCallback)data;
  JVar1 = ContextAPINoScriptWrapper<JsCreateExternalObjectWithPrototype::__0>(fn,false,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsCreateExternalObjectWithPrototype(_In_opt_ void *data,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef *object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }

        *object = JsrtExternalObject::Create(data, 0, finalizeCallback, prototypeObject, scriptContext, nullptr);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}